

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

LPWSTR __thiscall
CmdLineArgsParser::ParseString
          (CmdLineArgsParser *this,LPWSTR buffer,size_t ceBuffer,bool fTreatColonAsSeparator)

{
  WCHAR WVar1;
  WCHAR *pWVar2;
  undefined8 *puVar3;
  long lVar4;
  char16_t *pcVar5;
  ulong uVar6;
  
  pWVar2 = this->pszCurrentArg;
  WVar1 = *pWVar2;
  if (WVar1 == L'\"') {
    lVar4 = 0;
    for (uVar6 = 0; WVar1 = pWVar2[uVar6 + 1], WVar1 != L'\"'; uVar6 = uVar6 + 1) {
      if (WVar1 == L'\0') {
        this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (2 - lVar4));
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar5 = L"Unmatched quote";
        goto LAB_001e486e;
      }
      if (ceBuffer - 1 == uVar6) {
        this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (2 - lVar4));
        goto LAB_001e485d;
      }
      buffer[uVar6] = WVar1;
      lVar4 = lVar4 + -2;
    }
    this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (4 - lVar4));
LAB_001e481e:
    if (uVar6 != 0) {
      buffer[uVar6] = L'\0';
      return buffer;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = L"String Token Expected";
  }
  else {
    lVar4 = 0;
    uVar6 = 0;
    while( true ) {
      if ((ushort)WVar1 < 0x3e) {
        if ((0x2400200000000000U >> ((ulong)(ushort)WVar1 & 0x3f) & 1) == 0) {
          if ((0x100100000001U >> ((ulong)(ushort)WVar1 & 0x3f) & 1) != 0) goto LAB_001e481e;
        }
        else if (fTreatColonAsSeparator) goto LAB_001e481e;
      }
      if (0x1fe < uVar6) break;
      buffer[uVar6] = WVar1;
      this->pszCurrentArg = (LPWSTR)((long)pWVar2 + lVar4 + 2);
      WVar1 = pWVar2[uVar6 + 1];
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 2;
    }
LAB_001e485d:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = L"String token too large to parse";
  }
LAB_001e486e:
  *puVar3 = pcVar5;
  __cxa_throw(puVar3,&Exception::typeinfo,0);
}

Assistant:

LPWSTR
CmdLineArgsParser::ParseString(__inout_ecount(ceBuffer) LPWSTR buffer, size_t ceBuffer, bool fTreatColonAsSeparator)
{

    char16 *out = buffer;
    size_t len = 0;

    if('"' == CurChar())
    {
        NextChar();

        while('"' != CurChar())
        {
            if(0 == CurChar())
            {
                throw Exception(_u("Unmatched quote"));
            }

            //
            // MaxTokenSize - 1 because we need 1 extra position for null termination
            //
            if (len >= ceBuffer - 1)
            {
                throw Exception(_u("String token too large to parse"));
            }

            out[len++] = CurChar();

            NextChar();
        }
        NextChar();
    }
    else
    {
        bool fDone = false;

        while(!fDone)
        {
            switch(CurChar())
            {
            case ' ':
            case ',':
            case 0:
                fDone = true;
                break;
            case '-':
            case '=':
            case ':':
                if (fTreatColonAsSeparator)
                {
                    fDone = true;
                    break;
                }
                else
                {
                    // Fallthrough
                }
            default:
                if (len >= MaxTokenSize - 1)
                {
                    throw Exception(_u("String token too large to parse"));
                }
                out[len++] = CurChar();
                NextChar();
            }
        }
    }

    if(0 == len)
    {
        throw Exception(_u("String Token Expected"));
    }

    out[len] = '\0';

    return buffer;
}